

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR lcfuncall(uint atom_index,int argnum,int bytenum)

{
  LispPTR *pLVar1;
  short sVar2;
  DLword *pDVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  DLword *pDVar7;
  
  if (atom_index == 0xffffffff) {
    error("Loops punt to nonexistent fn");
  }
  pDVar7 = MachineState.csp;
  if (((ulong)MachineState.csp & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
  }
  MachineState.pvar[-5] =
       (short)((uint)((int)pDVar7 - (int)Lisp_world) >> 1) + (short)argnum * -2 + 4;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] =
       ((short)bytenum + (short)MachineState.currentpc) - (short)MachineState.currentfunc;
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = MachineState.tosvalue;
  if ((atom_index & 0xfff0000) == 0) {
    pDVar7 = AtomSpace + (ulong)(atom_index * 5) * 2;
  }
  else {
    if ((atom_index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)atom_index);
    }
    pDVar7 = (DLword *)((ulong)atom_index * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
  }
  uVar6 = (ulong)(*(uint *)(pDVar7 + 4) & 0xfffffff);
  if ((*(uint *)(pDVar7 + 4) & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
  }
  MachineState.currentfunc = (fnhead *)(CONCAT44(Lisp_world._4_4_,(int)Lisp_world) + uVar6 * 2);
  sVar2 = (MachineState.currentfunc)->na;
  if (-1 < sVar2) {
    iVar5 = argnum - sVar2;
    if (iVar5 < 0) {
      iVar5 = sVar2 - argnum;
      do {
        pDVar3 = MachineState.csp;
        MachineState.csp = MachineState.csp + 2;
        pDVar3[2] = 0;
        pDVar3[3] = 0;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      iVar5 = 0;
    }
    MachineState.csp = MachineState.csp + -(long)(iVar5 * 2);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  pDVar3 = MachineState.pvar;
  if (((ulong)MachineState.pvar & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.pvar);
  }
  *MachineState.csp = (DLword)((uint)((int)pDVar3 - (int)Lisp_world) >> 1);
  MachineState.pvar = MachineState.csp + 10;
  *(uint *)(MachineState.csp + 2) = *(uint *)(pDVar7 + 4) & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  if ((ushort)(MachineState.currentfunc)->pv < 0x7fff) {
    uVar4 = (MachineState.currentfunc)->pv + 2;
    do {
      pDVar7 = MachineState.csp + 1;
      MachineState.csp[0] = 0;
      *pDVar7 = 0xffff;
      pDVar7 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar7[2] = 0;
      pDVar7[3] = 0xffff;
      MachineState.csp = MachineState.csp + 2;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)&(MachineState.currentfunc)->na + (ulong)(MachineState.currentfunc)->startpc);
  return 0xfffffffe;
}

Assistant:

LispPTR lcfuncall(unsigned int atom_index, int argnum, int bytenum)
/* Atomindex for Function to invoke */
/* Number of ARGS on TOS and STK */
/* Number of bytes of Caller's
   OPCODE(including multi-byte) */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  if (atom_index == 0xffffffff) error("Loops punt to nonexistent fn");

  /* Get Next Block offset from argnum */
  CURRENTFX->nextblock = (LAddrFromNative(CurrentStackPTR) & 0x0ffff) - (argnum << 1) + 4 /* +3  */;

  /* Setup IVar */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj) + bytenum;

  PushCStack; /* save TOS */

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) >= (UNSIGNED)EndSTKP) {
    LispPTR test;
    test = *((LispPTR *)CurrentStackPTR);
    /* DOSTACKOVERFLOW(argnum,bytenum-1); XXX until we figure out what should be happening */
    S_CHECK(test == *((LispPTR *)CurrentStackPTR), "overflow in ccfuncall");
  }
  FuncObj = tmp_fn;

  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = argnum - FuncObj->na;

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  ((struct frameex1 *)CurrentStackPTR)->alink = LAddrFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((struct frameex1 *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((struct frameex1 *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((struct frameex1 *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
  ((struct frameex1 *)CurrentStackPTR)->hi1fnheader = 0;
#endif /* BIGVM */

  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1; /* Changed Apr.27 */

  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;

  return -2; /* signal to OP_miscn to leave stack & pc alone */
}